

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

size_t __thiscall
edition_unittest::TestNestedRequiredForeign::ByteSizeLong(TestNestedRequiredForeign *this)

{
  uint uVar1;
  int32_t value;
  uint32_t *puVar2;
  size_t sVar3;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  TestNestedRequiredForeign *this_;
  TestNestedRequiredForeign *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  sStack_58 = 0;
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  puVar2 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar2;
  if ((uVar1 & 0x7f) != 0) {
    if ((uVar1 & 1) != 0) {
      sStack_58 = google::protobuf::internal::WireFormatLite::
                  MessageSize<edition_unittest::TestNestedRequiredForeign>
                            ((this->field_0)._impl_.child_);
      sStack_58 = sStack_58 + 1;
    }
    if ((uVar1 & 2) != 0) {
      sVar3 = google::protobuf::internal::WireFormatLite::
              MessageSize<edition_unittest::TestRequiredForeign>((this->field_0)._impl_.payload_);
      sStack_58 = sVar3 + 1 + sStack_58;
    }
    if ((uVar1 & 4) != 0) {
      sVar3 = google::protobuf::internal::WireFormatLite::
              MessageSize<edition_unittest::TestRequiredEnum>((this->field_0)._impl_.required_enum_)
      ;
      sStack_58 = sVar3 + 1 + sStack_58;
    }
    if ((uVar1 & 8) != 0) {
      sVar3 = google::protobuf::internal::WireFormatLite::
              MessageSize<edition_unittest::TestRequiredEnumNoMask>
                        ((this->field_0)._impl_.required_enum_no_mask_);
      sStack_58 = sVar3 + 1 + sStack_58;
    }
    if ((uVar1 & 0x10) != 0) {
      sVar3 = google::protobuf::internal::WireFormatLite::
              MessageSize<edition_unittest::TestRequiredEnumMulti>
                        ((this->field_0)._impl_.required_enum_multi_);
      sStack_58 = sVar3 + 1 + sStack_58;
    }
    if ((uVar1 & 0x20) != 0) {
      sVar3 = google::protobuf::internal::WireFormatLite::
              MessageSize<edition_unittest::TestRequiredNoMaskMulti>
                        ((this->field_0)._impl_.required_no_mask_);
      sStack_58 = sVar3 + 1 + sStack_58;
    }
    if ((uVar1 & 0x40) != 0) {
      value = _internal_dummy(this);
      sVar3 = google::protobuf::internal::WireFormatLite::Int32SizePlusOne(value);
      sStack_58 = sVar3 + sStack_58;
    }
  }
  sVar3 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t TestNestedRequiredForeign::ByteSizeLong() const {
  const TestNestedRequiredForeign& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:edition_unittest.TestNestedRequiredForeign)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000007fu) != 0) {
    // .edition_unittest.TestNestedRequiredForeign child = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.child_);
    }
    // .edition_unittest.TestRequiredForeign payload = 2;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.payload_);
    }
    // .edition_unittest.TestRequiredEnum required_enum = 5;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.required_enum_);
    }
    // .edition_unittest.TestRequiredEnumNoMask required_enum_no_mask = 6;
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.required_enum_no_mask_);
    }
    // .edition_unittest.TestRequiredEnumMulti required_enum_multi = 7;
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.required_enum_multi_);
    }
    // .edition_unittest.TestRequiredNoMaskMulti required_no_mask = 9;
    if ((cached_has_bits & 0x00000020u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.required_no_mask_);
    }
    // int32 dummy = 3;
    if ((cached_has_bits & 0x00000040u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_dummy());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}